

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

bool re2::Regexp::Equal(Regexp *a,Regexp *b)

{
  byte bVar1;
  ulong uVar2;
  anon_union_8_2_3df47e5c_for_Regexp_7 *paVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  Regexp *b2;
  Regexp *a2;
  vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> stk;
  Regexp *local_58;
  Regexp *local_50;
  void *local_48;
  iterator iStack_40;
  Regexp **local_38;
  
  if (a == (Regexp *)0x0 || b == (Regexp *)0x0) {
    bVar6 = a == b;
  }
  else {
    bVar6 = TopEqual(a,b);
    if (bVar6) {
      bVar1 = a->op_;
      bVar6 = true;
      if (bVar1 - 5 < 7) {
        local_48 = (void *)0x0;
        iStack_40._M_current = (Regexp **)0x0;
        local_38 = (Regexp **)0x0;
        do {
          if (bVar1 - 7 < 5) {
            if (a->nsub_ < 2) {
              paVar3 = &a->field_5;
            }
            else {
              paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(a->field_5).submany_;
            }
            local_50 = paVar3->subone_;
            if (b->nsub_ < 2) {
              paVar3 = &b->field_5;
            }
            else {
              paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(b->field_5).submany_;
            }
            local_58 = paVar3->subone_;
            bVar6 = TopEqual(local_50,local_58);
            b = local_58;
            a = local_50;
            if (!bVar6) {
LAB_001c00c2:
              bVar6 = false;
LAB_001c00c9:
              if (local_48 == (void *)0x0) {
                return bVar6;
              }
              operator_delete(local_48);
              return bVar6;
            }
          }
          else {
            if ((bVar1 - 5 < 2) && (uVar2 = (ulong)a->nsub_, a->nsub_ != 0)) {
              uVar5 = 0;
              do {
                paVar3 = &a->field_5;
                if (1 < (ushort)uVar2) {
                  paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(a->field_5).submany_;
                }
                local_50 = paVar3[uVar5].subone_;
                paVar3 = &b->field_5;
                if (1 < b->nsub_) {
                  paVar3 = (anon_union_8_2_3df47e5c_for_Regexp_7 *)(b->field_5).submany_;
                }
                local_58 = paVar3[uVar5].subone_;
                bVar6 = TopEqual(local_50,local_58);
                if (!bVar6) goto LAB_001c00c2;
                if (iStack_40._M_current == local_38) {
                  std::vector<re2::Regexp*,std::allocator<re2::Regexp*>>::
                  _M_realloc_insert<re2::Regexp*const&>
                            ((vector<re2::Regexp*,std::allocator<re2::Regexp*>> *)&local_48,
                             iStack_40,&local_50);
                }
                else {
                  *iStack_40._M_current = local_50;
                  iStack_40._M_current = iStack_40._M_current + 1;
                }
                if (iStack_40._M_current == local_38) {
                  std::vector<re2::Regexp*,std::allocator<re2::Regexp*>>::
                  _M_realloc_insert<re2::Regexp*const&>
                            ((vector<re2::Regexp*,std::allocator<re2::Regexp*>> *)&local_48,
                             iStack_40,&local_58);
                }
                else {
                  *iStack_40._M_current = local_58;
                  iStack_40._M_current = iStack_40._M_current + 1;
                }
                uVar5 = uVar5 + 1;
                uVar2 = (ulong)a->nsub_;
              } while (uVar5 < uVar2);
            }
            if ((long)iStack_40._M_current - (long)local_48 == 0) {
              bVar6 = true;
              goto LAB_001c00c9;
            }
            lVar4 = (long)iStack_40._M_current - (long)local_48 >> 3;
            a = *(Regexp **)((long)local_48 + lVar4 * 8 + -0x10);
            b = iStack_40._M_current[-1];
            std::vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_>::resize
                      ((vector<re2::Regexp_*,_std::allocator<re2::Regexp_*>_> *)&local_48,lVar4 - 2)
            ;
          }
          bVar1 = a->op_;
        } while( true );
      }
    }
    else {
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool Regexp::Equal(Regexp* a, Regexp* b) {
  if (a == NULL || b == NULL)
    return a == b;

  if (!TopEqual(a, b))
    return false;

  // Fast path:
  // return without allocating vector if there are no subregexps.
  switch (a->op()) {
    case kRegexpAlternate:
    case kRegexpConcat:
    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest:
    case kRegexpRepeat:
    case kRegexpCapture:
      break;

    default:
      return true;
  }

  // Committed to doing real work.
  // The stack (vector) has pairs of regexps waiting to
  // be compared.  The regexps are only equal if
  // all the pairs end up being equal.
  std::vector<Regexp*> stk;

  for (;;) {
    // Invariant: TopEqual(a, b) == true.
    Regexp* a2;
    Regexp* b2;
    switch (a->op()) {
      default:
        break;
      case kRegexpAlternate:
      case kRegexpConcat:
        for (int i = 0; i < a->nsub(); i++) {
          a2 = a->sub()[i];
          b2 = b->sub()[i];
          if (!TopEqual(a2, b2))
            return false;
          stk.push_back(a2);
          stk.push_back(b2);
        }
        break;

      case kRegexpStar:
      case kRegexpPlus:
      case kRegexpQuest:
      case kRegexpRepeat:
      case kRegexpCapture:
        a2 = a->sub()[0];
        b2 = b->sub()[0];
        if (!TopEqual(a2, b2))
          return false;
        // Really:
        //   stk.push_back(a2);
        //   stk.push_back(b2);
        //   break;
        // but faster to assign directly and loop.
        a = a2;
        b = b2;
        continue;
    }

    size_t n = stk.size();
    if (n == 0)
      break;

    DCHECK_GE(n, 2);
    a = stk[n-2];
    b = stk[n-1];
    stk.resize(n-2);
  }

  return true;
}